

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O3

void flatbuffers::tests::proto_test_include_union_id
               (string *proto_path,string *proto_file,string *import_proto_file)

{
  pointer pcVar1;
  bool expval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string golden_file;
  IDLOptions opts;
  long *local_398 [2];
  long local_388 [2];
  string local_378;
  string local_358;
  IDLOptions local_338;
  
  IDLOptions::IDLOptions(&local_338);
  local_338.include_dependence_headers = true;
  local_338.proto_mode = true;
  local_338.proto_oneof_union = true;
  local_338.keep_proto_id = true;
  local_338.proto_id_gap_action = NO_OP;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  pcVar1 = (proto_path->_M_dataplus)._M_p;
  local_398[0] = local_388;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_398,pcVar1,pcVar1 + proto_path->_M_string_length);
  std::__cxx11::string::append((char *)local_398);
  expval = LoadFile((char *)local_398[0],false,&local_358);
  TestEq<bool,bool>(expval,true,
                    "\'flatbuffers::LoadFile( (proto_path + \"test_union_include_id.golden.fbs\").c_str(), false, &golden_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0xdb,"");
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  pcVar1 = (import_proto_file->_M_dataplus)._M_p;
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,pcVar1,pcVar1 + import_proto_file->_M_string_length);
  RunTest(&local_338,proto_path,proto_file,&local_358,&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  IDLOptions::~IDLOptions(&local_338);
  return;
}

Assistant:

void proto_test_include_union_id(const std::string &proto_path,
                                 const std::string &proto_file,
                                 const std::string &import_proto_file) {
  flatbuffers::IDLOptions opts;
  opts.include_dependence_headers = true;
  opts.proto_mode = true;
  opts.proto_oneof_union = true;
  opts.keep_proto_id = true;
  opts.proto_id_gap_action = IDLOptions::ProtoIdGapAction::NO_OP;

  std::string golden_file;
  TEST_EQ(flatbuffers::LoadFile(
              (proto_path + "test_union_include_id.golden.fbs").c_str(), false,
              &golden_file),
          true);

  RunTest(opts, proto_path, proto_file, golden_file, import_proto_file);
}